

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicationFolder.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
license::locate::ApplicationFolder::license_locations_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,ApplicationFolder *this,EventRegistry *eventRegistry)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FUNCTION_RETURN FVar2;
  int *piVar3;
  size_t sVar4;
  long *plVar5;
  size_type *psVar6;
  LCC_EVENT_TYPE_conflict event;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar8;
  string temptativeLicense;
  string module_name;
  ifstream f;
  char fname [1024];
  value_type local_670;
  string local_650;
  string local_630;
  int aiStack_610 [122];
  char local_428 [1024];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memset(local_428,0,0x400);
  FVar2 = getModuleName(local_428);
  if (FVar2 == FUNC_RET_OK) {
    paVar1 = &local_630.field_2;
    local_630._M_dataplus._M_p = (pointer)paVar1;
    sVar4 = strlen(local_428);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_630,local_428,local_428 + sVar4);
    remove_extension(&local_650,&local_630);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_630._M_dataplus._M_p != paVar1) {
      operator_delete(local_630._M_dataplus._M_p);
    }
    local_630._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_630,local_650._M_dataplus._M_p,
               local_650._M_dataplus._M_p + local_650._M_string_length);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_630);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_670.field_2._M_allocated_capacity = *psVar6;
      local_670.field_2._8_8_ = plVar5[3];
      local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
    }
    else {
      local_670.field_2._M_allocated_capacity = *psVar6;
      local_670._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_670._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_630._M_dataplus._M_p != paVar1) {
      operator_delete(local_630._M_dataplus._M_p);
    }
    std::ifstream::ifstream(&local_630,local_670._M_dataplus._M_p,_S_in);
    event = LICENSE_FILE_NOT_FOUND;
    if (*(int *)((long)aiStack_610 + *(long *)(local_630._M_dataplus._M_p + -0x18)) == 0) {
      event = LICENSE_FOUND;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_670);
    }
    EventRegistry::addEvent(eventRegistry,event,local_670._M_dataplus._M_p,(char *)0x0);
    std::ifstream::close();
    std::ifstream::~ifstream(&local_630);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670._M_dataplus._M_p != &local_670.field_2) {
      operator_delete(local_670._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_650._M_dataplus._M_p != &local_650.field_2) {
      operator_delete(local_650._M_dataplus._M_p);
    }
  }
  else {
    piVar3 = __errno_location();
    uVar7 = extraout_XMM0_Da;
    uVar8 = extraout_XMM0_Db;
    if (*piVar3 != 0) {
      strerror(*piVar3);
      uVar7 = extraout_XMM0_Da_00;
      uVar8 = extraout_XMM0_Db_00;
    }
    _log((double)CONCAT44(uVar8,uVar7));
  }
  return __return_storage_ptr__;
}

Assistant:

const vector<string> ApplicationFolder::license_locations(EventRegistry &eventRegistry) {
	vector<string> diskFiles;
	char fname[MAX_PATH] = {0};
	const FUNCTION_RETURN fret = getModuleName(fname);
	if (fret == FUNC_RET_OK) {
		const string module_name = remove_extension(fname);
		const string temptativeLicense = string(module_name) + LCC_LICENSE_FILE_EXTENSION;
		ifstream f(temptativeLicense.c_str());
		if (f.good()) {
			diskFiles.push_back(temptativeLicense);
			eventRegistry.addEvent(LICENSE_FOUND, temptativeLicense.c_str());
		} else {
			eventRegistry.addEvent(LICENSE_FILE_NOT_FOUND, temptativeLicense.c_str());
		}
		f.close();
	} else {
		LOG_WARN("Error determining module name.");
	}
	return diskFiles;
}